

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O1

set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> * __thiscall
Assimp::Ogre::IVertexData::ReferencedBonesByWeights
          (set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
           *__return_storage_ptr__,IVertexData *this)

{
  _Rb_tree_header *p_Var1;
  pointer pVVar2;
  VertexBoneAssignment *boneAssign;
  pointer pVVar3;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pVVar2 = (this->boneAssignments).
           super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pVVar3 = (this->boneAssignments).
                super__Vector_base<Assimp::Ogre::VertexBoneAssignment,_std::allocator<Assimp::Ogre::VertexBoneAssignment>_>
                ._M_impl.super__Vector_impl_data._M_start; pVVar3 != pVVar2; pVVar3 = pVVar3 + 1) {
    std::
    _Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
    ::_M_insert_unique<unsigned_short_const&>
              ((_Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
                *)__return_storage_ptr__,&pVVar3->boneIndex);
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<uint16_t> IVertexData::ReferencedBonesByWeights() const
{
    std::set<uint16_t> referenced;
    for (const auto &boneAssign : boneAssignments)
    {
        referenced.insert(boneAssign.boneIndex);
    }
    return referenced;
}